

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_string.c
# Opt level: O1

wchar_t cesu8_to_unicode(uint32_t *pwc,char *s,size_t n)

{
  bool bVar1;
  uint32_t uVar2;
  wchar_t wVar3;
  wchar_t wVar4;
  uint32_t wc;
  uint32_t wc2;
  uint32_t local_30;
  uint32_t local_2c;
  
  local_30 = 0;
  wVar3 = _utf8_to_unicode(&local_30,s,n);
  uVar2 = local_30;
  if ((local_30 & 0xfffffc00) != 0xd800 || (wVar3 ^ 3U) != 0) {
    wVar4 = L'\x03';
    if ((wVar3 ^ 3U) == 0 && (local_30 & 0xfffffc00) == 0xdc00) goto LAB_0016aeeb;
    goto LAB_0016af4e;
  }
  local_2c = 0;
  if (n - 3 < 3) {
    wVar3 = L'\x03';
LAB_0016af46:
    bVar1 = false;
  }
  else {
    wVar3 = _utf8_to_unicode(&local_2c,s + 3,n - 3);
    if ((local_2c & 0xfffffc00) != 0xdc00 || wVar3 != L'\x03') goto LAB_0016af46;
    local_30 = local_2c + uVar2 * 0x400 + 0xfca02400;
    bVar1 = true;
    wVar3 = L'\x06';
  }
  wVar4 = wVar3;
  if (!bVar1) {
LAB_0016aeeb:
    *pwc = 0xfffd;
    if (L'\0' < wVar4) {
      return -wVar4;
    }
    return wVar4;
  }
LAB_0016af4e:
  *pwc = local_30;
  return wVar3;
}

Assistant:

static int
cesu8_to_unicode(uint32_t *pwc, const char *s, size_t n)
{
	uint32_t wc = 0;
	int cnt;

	cnt = _utf8_to_unicode(&wc, s, n);
	if (cnt == 3 && IS_HIGH_SURROGATE_LA(wc)) {
		uint32_t wc2 = 0;
		if (n - 3 < 3) {
			/* Invalid byte sequence. */
			goto invalid_sequence;
		}
		cnt = _utf8_to_unicode(&wc2, s+3, n-3);
		if (cnt != 3 || !IS_LOW_SURROGATE_LA(wc2)) {
			/* Invalid byte sequence. */
			goto invalid_sequence;
		}
		wc = combine_surrogate_pair(wc, wc2);
		cnt = 6;
	} else if (cnt == 3 && IS_LOW_SURROGATE_LA(wc)) {
		/* Invalid byte sequence. */
		goto invalid_sequence;
	}
	*pwc = wc;
	return (cnt);
invalid_sequence:
	*pwc = UNICODE_R_CHAR;/* set the Replacement Character instead. */
	if (cnt > 0)
		cnt *= -1;
	return (cnt);
}